

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void deqp::gls::LifetimeTests::details::drawFbo(Context *ctx,GLuint fbo,Surface *dst)

{
  Functions *context;
  int iVar1;
  deUint32 dVar2;
  deBool dVar3;
  undefined4 extraout_var;
  PixelBufferAccess local_58;
  long local_30;
  Functions *gl;
  RenderContext *renderCtx;
  Surface *dst_local;
  Context *pCStack_10;
  GLuint fbo_local;
  Context *ctx_local;
  
  renderCtx = (RenderContext *)dst;
  dst_local._4_4_ = fbo;
  pCStack_10 = ctx;
  gl = (Functions *)Context::getRenderContext(ctx);
  iVar1 = (**(_func_int **)((long)gl->activeShaderProgram + 0x18))();
  local_30 = CONCAT44(extraout_var,iVar1);
  do {
    (**(code **)(local_30 + 0x78))(0x8d40,dst_local._4_4_);
    dVar2 = (**(code **)(local_30 + 0x800))();
    glu::checkError(dVar2,"gl.bindFramebuffer(GL_FRAMEBUFFER, fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0xed);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::Surface::setSize((Surface *)renderCtx,0x80,0x80);
  context = gl;
  tcu::Surface::getAccess(&local_58,(Surface *)renderCtx);
  glu::readPixels((RenderContext *)context,0,0,&local_58);
  dVar2 = (**(code **)(local_30 + 0x800))();
  glu::checkError(dVar2,"Read pixels from framebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0xf1);
  do {
    (**(code **)(local_30 + 0x78))(0x8d40,0);
    dVar2 = (**(code **)(local_30 + 0x800))();
    glu::checkError(dVar2,"gl.bindFramebuffer(GL_FRAMEBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0xf5);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  return;
}

Assistant:

void drawFbo (const Context& ctx, GLuint fbo, Surface& dst)
{
	const RenderContext& renderCtx = ctx.getRenderContext();
	const Functions& gl = renderCtx.getFunctions();

	GLU_CHECK_CALL_ERROR(
		gl.bindFramebuffer(GL_FRAMEBUFFER, fbo),
		gl.getError());

	dst.setSize(FRAMEBUFFER_SIZE, FRAMEBUFFER_SIZE);
	glu::readPixels(renderCtx, 0, 0, dst.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels from framebuffer");

	GLU_CHECK_CALL_ERROR(
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0),
		gl.getError());
}